

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__get16le(stbi__context *s)

{
  stbi_uc *psVar1;
  int iVar2;
  uint uVar3;
  byte *pbVar4;
  uint uVar5;
  
  pbVar4 = s->img_buffer;
  if (pbVar4 < s->img_buffer_end) {
LAB_00190f55:
    s->img_buffer = pbVar4 + 1;
    uVar5 = (uint)*pbVar4;
  }
  else {
    if (s->read_from_callbacks != 0) {
      psVar1 = s->buffer_start;
      iVar2 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
      if (iVar2 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar1;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar1;
        s->img_buffer_end = psVar1 + iVar2;
      }
      pbVar4 = s->img_buffer;
      goto LAB_00190f55;
    }
    uVar5 = 0;
  }
  pbVar4 = s->img_buffer;
  if (s->img_buffer_end <= pbVar4) {
    if (s->read_from_callbacks == 0) {
      uVar3 = 0;
      goto LAB_00190fdc;
    }
    psVar1 = s->buffer_start;
    iVar2 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
    if (iVar2 == 0) {
      s->read_from_callbacks = 0;
      s->img_buffer = psVar1;
      s->img_buffer_end = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
    }
    else {
      s->img_buffer = psVar1;
      s->img_buffer_end = psVar1 + iVar2;
    }
    pbVar4 = s->img_buffer;
  }
  s->img_buffer = pbVar4 + 1;
  uVar3 = (uint)*pbVar4 << 8;
LAB_00190fdc:
  return uVar3 | uVar5;
}

Assistant:

static int stbi__get16le(stbi__context *s)
{
   int z = stbi__get8(s);
   return z + (stbi__get8(s) << 8);
}